

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O0

bool __thiscall CompilationContext::isWarningSuppressed(CompilationContext *this,char *text_id)

{
  bool bVar1;
  int iVar2;
  iterator __first;
  iterator __last;
  char *in_RSI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  int i;
  int id;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc8;
  uint local_18;
  
  local_18 = 0;
  while ((local_18 < 0x59 &&
         (iVar2 = strcmp(in_RSI,analyzer_messages[(int)local_18].textId), iVar2 != 0))) {
    local_18 = local_18 + 1;
  }
  __first = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffb8);
  __last = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
  std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             in_stack_ffffffffffffffc8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator!=
                    (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffffb8);
  return bVar1;
}

Assistant:

bool CompilationContext::isWarningSuppressed(const char * text_id)
{
  int id = -1;
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
    if (!strcmp(text_id, analyzer_messages[i].textId))
    {
      id = analyzer_messages[i].intId;
      break;
    }

  return (std::find(suppressWarnings.begin(), suppressWarnings.end(), id) != suppressWarnings.end());
}